

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,int64 value)

{
  int32 iVar1;
  uint size;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  iVar1 = WriteID(writer,type);
  if (iVar1 == 0) {
    size = GetIntSize(value);
    iVar1 = WriteUInt(writer,(ulong)size);
    if (iVar1 == 0) {
      iVar1 = SerializeInt(writer,value,size);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, int64 value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return 0;

  const uint64 size = GetIntSize(value);
  if (WriteUInt(writer, size))
    return false;

  if (SerializeInt(writer, value, static_cast<int32>(size)))
    return false;

  return true;
}